

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O2

Uint32 __thiscall
Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::AllocateDynamicBufferId
          (RenderDeviceBase<Diligent::EngineGLImplTraits> *this)

{
  atomic<unsigned_int> *paVar1;
  pointer puVar2;
  Uint32 UVar3;
  Uint32 Id;
  
  Threading::SpinLock::lock(&this->m_RecycledDynamicBufferIdsLock);
  puVar2 = (this->m_RecycledDynamicBufferIds).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->m_RecycledDynamicBufferIds).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start == puVar2) {
    LOCK();
    paVar1 = &this->m_NextDynamicBufferId;
    UVar3 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
    (paVar1->super___atomic_base<unsigned_int>)._M_i =
         (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
  }
  else {
    UVar3 = puVar2[-1];
    (this->m_RecycledDynamicBufferIds).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar2 + -1;
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(this->m_DbgRecycledDynamicBufferIds)._M_h);
  }
  Threading::SpinLock::unlock(&this->m_RecycledDynamicBufferIdsLock);
  return UVar3;
}

Assistant:

Uint32 AllocateDynamicBufferId()
    {
        Threading::SpinLockGuard Guard{m_RecycledDynamicBufferIdsLock};
        if (!m_RecycledDynamicBufferIds.empty())
        {
            Uint32 Id = m_RecycledDynamicBufferIds.back();
            m_RecycledDynamicBufferIds.pop_back();
#ifdef DILIGENT_DEBUG
            m_DbgRecycledDynamicBufferIds.erase(Id);
#endif
            return Id;
        }
        else
        {
            return m_NextDynamicBufferId.fetch_add(1);
        }
    }